

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

put_transaction<Func> * __thiscall
density::
sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
::
try_start_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func,int>
          (put_transaction<Func> *__return_storage_ptr__,
          sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
          *this,progress_guarantee i_progress_guarantee,int *i_construction_params)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> FVar2;
  put_transaction<Func> local_a8;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *local_78;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *type_storage;
  runtime_type *type;
  undefined1 local_60 [7];
  bool is_noexcept;
  undefined1 local_40 [8];
  Allocation push_data;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  detail::
  LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>>
  ::try_inplace_allocate<1ul,true,4ul,4ul>((Allocation *)local_40,this,i_progress_guarantee);
  if (push_data.m_next_ptr == 0) {
    memset(local_60,0,0x20);
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<Func>::put_transaction((put_transaction<Func> *)local_60);
    put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func>
    ::
    put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func,void>
              ((put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,(put_transaction<Func> *)local_60);
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_60);
  }
  else {
    type._7_1_ = 0;
    type_storage = (FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *)0x0;
    pFVar1 = detail::
             LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
             ::type_after_control((ControlBlock *)local_40);
    local_78 = pFVar1;
    FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::make<Func>();
    *pFVar1 = FVar2;
    type_storage = pFVar1;
    density_tests::
    SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0>
    ::func_queue_try_put_samples::Func::Func((Func *)push_data.m_next_ptr,*push_data.m_user_storage)
    ;
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<Func>::put_transaction
              (&local_a8,0,
               (sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                *)this,(Allocation *)local_40);
    put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func>
    ::
    put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func,void>
              ((put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_try_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,&local_a8);
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<Func>::~put_transaction(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE>
          try_start_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }